

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

ON_Brep * ON_BrepWedge(ON_3dPoint *corners,ON_Brep *pBrep)

{
  ON_CurveArray *this;
  ulong uVar1;
  long lVar2;
  undefined8 *puVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ON_Surface *pOVar8;
  ON_3dPoint vertex_point;
  int si;
  ON_Brep *this_00;
  long lVar9;
  ON_LineCurve *pOVar10;
  ulong uVar11;
  ulong uVar12;
  ON_NurbsSurface *pS;
  double *pdVar13;
  ON_BrepFace *face;
  ON_BrepLoop *loop;
  ON_BrepTrim *pOVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ON_3dPoint *this_01;
  ON_BrepEdge *edge;
  ON_BrepVertex *pOVar18;
  ON_3dPoint *p;
  ON_3dPoint *this_02;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_Interval s;
  ON_2dPoint p0;
  ON_Interval t;
  ON_2dPoint p3;
  ON_2dPoint p1;
  ON_2dPoint p2;
  ON_3dPoint local_c0;
  ON_BrepEdge *local_a8;
  ON_BrepEdge *local_a0;
  ON_2dPoint local_98;
  ON_3dVector local_88;
  ON_Brep *local_70;
  ON_BrepEdge *local_68;
  ON_2dPoint local_60;
  ON_2dPoint local_50;
  ON_2dPoint local_40;
  
  if (corners != (ON_3dPoint *)0x0) {
    if (pBrep == (ON_Brep *)0x0) {
      this_00 = (ON_Brep *)operator_new(0x138);
      ON_Brep::ON_Brep(this_00);
    }
    else {
      ON_Brep::Destroy(pBrep);
      this_00 = pBrep;
    }
    if ((uint)(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_capacity < 0x12) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity
                (&(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>,0x12);
    }
    this = &this_00->m_C3;
    if ((uint)(this_00->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_capacity < 9) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity(&this->super_ON_SimpleArray<ON_Curve_*>,9);
    }
    if ((uint)(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_capacity < 5) {
      ON_SimpleArray<ON_Surface_*>::SetCapacity
                (&(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>,5);
    }
    if ((uint)(this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
              m_capacity < 6) {
      ON_ClassArray<ON_BrepVertex>::SetCapacity((ON_ClassArray<ON_BrepVertex> *)&this_00->m_V,6);
    }
    if ((uint)(this_00->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
              m_capacity < 9) {
      ON_ClassArray<ON_BrepEdge>::SetCapacity((ON_ClassArray<ON_BrepEdge> *)&this_00->m_E,9);
    }
    if ((uint)(this_00->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
              m_capacity < 5) {
      ON_ClassArray<ON_BrepLoop>::SetCapacity((ON_ClassArray<ON_BrepLoop> *)&this_00->m_L,5);
    }
    if ((uint)(this_00->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
              m_capacity < 0x12) {
      ON_ClassArray<ON_BrepTrim>::SetCapacity((ON_ClassArray<ON_BrepTrim> *)&this_00->m_T,0x12);
    }
    local_70 = pBrep;
    if ((uint)(this_00->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
              m_capacity < 5) {
      ON_ClassArray<ON_BrepFace>::SetCapacity((ON_ClassArray<ON_BrepFace> *)&this_00->m_F,5);
    }
    lVar15 = 0;
    do {
      vertex_point.z = *(double *)((long)&corners->z + lVar15);
      vertex_point._0_16_ = *(undefined1 (*) [16])((long)&corners->x + lVar15);
      ON_Brep::NewVertex(this_00,vertex_point,0.0);
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x90);
    lVar16 = 0;
    lVar15 = 0;
    do {
      pOVar18 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                super_ON_ClassArray<ON_BrepVertex>.m_a;
      lVar2 = lVar15 + 1;
      lVar9 = 0;
      if (lVar15 != 2) {
        lVar9 = lVar2;
      }
      pOVar10 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar10,(ON_3dPoint *)((long)&(pOVar18->super_ON_Point).point.x + lVar16),
                 &pOVar18[lVar9].super_ON_Point.point);
      local_c0.x = (double)pOVar10;
      ON_SimpleArray<ON_Curve_*>::Append
                (&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_c0);
      ON_Brep::NewEdge(this_00,(ON_BrepVertex *)
                               ((long)&(pOVar18->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                       _vptr_ON_Object + lVar16),pOVar18 + lVar9,(int)lVar15,
                       (ON_Interval *)0x0,0.0);
      lVar16 = lVar16 + 0x58;
      lVar15 = lVar2;
    } while (lVar2 != 3);
    lVar15 = 0x108;
    uVar11 = 3;
    do {
      pOVar18 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                super_ON_ClassArray<ON_BrepVertex>.m_a;
      uVar1 = uVar11 + 1;
      uVar12 = uVar1 & 0xffffffff;
      if (lVar15 == 0x1b8) {
        uVar12 = 3;
      }
      pOVar10 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar10,(ON_3dPoint *)((long)&(pOVar18->super_ON_Point).point.x + lVar15),
                 &pOVar18[uVar12].super_ON_Point.point);
      local_c0.x = (double)pOVar10;
      ON_SimpleArray<ON_Curve_*>::Append
                (&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_c0);
      ON_Brep::NewEdge(this_00,(ON_BrepVertex *)
                               ((long)&(pOVar18->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                       _vptr_ON_Object + lVar15),pOVar18 + uVar12,(int)uVar11,
                       (ON_Interval *)0x0,0.0);
      lVar15 = lVar15 + 0x58;
      uVar11 = uVar1;
    } while (uVar1 != 6);
    iVar17 = 6;
    lVar15 = 0;
    do {
      pOVar18 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                super_ON_ClassArray<ON_BrepVertex>.m_a;
      pOVar10 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar10,(ON_3dPoint *)((long)&(pOVar18->super_ON_Point).point.x + lVar15),
                 (ON_3dPoint *)((long)&pOVar18[3].super_ON_Point.point.x + lVar15));
      pOVar18 = (ON_BrepVertex *)
                ((long)&(pOVar18->super_ON_Point).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                + lVar15);
      local_c0.x = (double)pOVar10;
      ON_SimpleArray<ON_Curve_*>::Append
                (&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_c0);
      ON_Brep::NewEdge(this_00,pOVar18,pOVar18 + 3,iVar17,(ON_Interval *)0x0,0.0);
      iVar17 = iVar17 + 1;
      lVar15 = lVar15 + 0x58;
    } while (lVar15 != 0x108);
    lVar15 = 0x1c;
    do {
      pOVar18 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                super_ON_ClassArray<ON_BrepVertex>.m_a;
      local_68 = (this_00->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                 m_a;
      edge = local_68 + *(int *)(&UNK_006a88d4 + lVar15);
      local_a0 = local_68 + *(int *)(&UNK_006a88d8 + lVar15);
      local_a8 = local_68 + *(int *)(&UNK_006a88dc + lVar15);
      iVar17 = *(int *)(&UNK_006a88e0 + lVar15);
      local_68 = local_68 + iVar17;
      iVar5 = *(int *)(&UNK_006a88e4 + lVar15);
      iVar6 = *(int *)(&UNK_006a88e8 + lVar15);
      iVar7 = *(int *)(&UNK_006a88ec + lVar15);
      if ((long)iVar17 < 0) {
        p = &pOVar18[edge->m_vi[iVar5 != 0]].super_ON_Point.point;
        this_01 = &pOVar18[local_a0->m_vi[iVar6 != 0]].super_ON_Point.point;
        this_02 = &pOVar18[local_a8->m_vi[iVar7 != 0]].super_ON_Point.point;
        ON_3dPoint::operator-(&local_88,this_02,p);
        ON_3dPoint::operator+(&local_c0,this_01,&local_88);
        pS = ON_NurbsSurfaceQuadrilateral(p,this_01,&local_c0,this_02,(ON_NurbsSurface *)0x0);
      }
      else {
        pS = ON_NurbsSurfaceQuadrilateral
                       (&pOVar18[edge->m_vi[iVar5 != 0]].super_ON_Point.point,
                        &pOVar18[local_a0->m_vi[iVar6 != 0]].super_ON_Point.point,
                        &pOVar18[local_a8->m_vi[iVar7 != 0]].super_ON_Point.point,
                        &pOVar18[local_68->m_vi[*(int *)((long)&DAT_006a88f0 + lVar15) != 0]].
                         super_ON_Point.point,(ON_NurbsSurface *)0x0);
      }
      si = ON_Brep::AddSurface(this_00,&pS->super_ON_Surface);
      pOVar8 = (this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[si];
      (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pOVar8,0);
      local_c0.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_c0.y = in_XMM1_Qa;
      (*((this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[si]->super_ON_Geometry).
        super_ON_Object._vptr_ON_Object[0x26])();
      local_88.y = in_XMM1_Qa;
      pdVar13 = ON_Interval::operator[]((ON_Interval *)&local_c0,0);
      dVar4 = *pdVar13;
      pdVar13 = ON_Interval::operator[]((ON_Interval *)&local_88,0);
      ON_2dPoint::Set(&local_98,dVar4,*pdVar13);
      pdVar13 = ON_Interval::operator[]((ON_Interval *)&local_c0,1);
      dVar4 = *pdVar13;
      pdVar13 = ON_Interval::operator[]((ON_Interval *)&local_88,0);
      ON_2dPoint::Set(&local_50,dVar4,*pdVar13);
      pdVar13 = ON_Interval::operator[]((ON_Interval *)&local_c0,1);
      dVar4 = *pdVar13;
      pdVar13 = ON_Interval::operator[]((ON_Interval *)&local_88,1);
      ON_2dPoint::Set(&local_40,dVar4,*pdVar13);
      pdVar13 = ON_Interval::operator[]((ON_Interval *)&local_c0,0);
      dVar4 = *pdVar13;
      pdVar13 = ON_Interval::operator[]((ON_Interval *)&local_88,1);
      in_XMM1_Qa = *pdVar13;
      ON_2dPoint::Set(&local_60,dVar4,in_XMM1_Qa);
      face = ON_Brep::NewFace(this_00,si);
      loop = ON_Brep::NewLoop(this_00,outer,face);
      pOVar10 = (ON_LineCurve *)operator_new(0x58);
      if (iVar17 < 0) {
        ON_LineCurve::ON_LineCurve(pOVar10,&local_98,&local_50);
        iVar17 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar10);
        pOVar14 = ON_Brep::NewTrim(this_00,edge,iVar5 != 0,loop,iVar17);
        pOVar14->m_iso = S_iso;
        pOVar10 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar10,&local_50,&local_60);
        iVar17 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar10);
        pOVar14 = ON_Brep::NewTrim(this_00,local_a0,iVar6 != 0,loop,iVar17);
        pOVar14->m_iso = not_iso;
        pOVar10 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar10,&local_60,&local_98);
        iVar17 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar10);
        pOVar14 = ON_Brep::NewTrim(this_00,local_a8,iVar7 != 0,loop,iVar17);
      }
      else {
        ON_LineCurve::ON_LineCurve(pOVar10,&local_98,&local_50);
        iVar17 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar10);
        pOVar14 = ON_Brep::NewTrim(this_00,edge,iVar5 != 0,loop,iVar17);
        pOVar14->m_iso = S_iso;
        pOVar10 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar10,&local_50,&local_40);
        iVar17 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar10);
        pOVar14 = ON_Brep::NewTrim(this_00,local_a0,iVar6 != 0,loop,iVar17);
        pOVar14->m_iso = E_iso;
        pOVar10 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar10,&local_40,&local_60);
        iVar17 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar10);
        pOVar14 = ON_Brep::NewTrim(this_00,local_a8,iVar7 != 0,loop,iVar17);
        pOVar14->m_iso = N_iso;
        pOVar10 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar10,&local_60,&local_98);
        iVar17 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar10);
        pOVar14 = ON_Brep::NewTrim(this_00,local_68,*(int *)((long)&DAT_006a88f0 + lVar15) != 0,loop
                                   ,iVar17);
      }
      pOVar14->m_iso = W_iso;
      lVar15 = lVar15 + 0x20;
    } while (lVar15 != 0xbc);
    lVar15 = (long)(this_00->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>
                   .m_count;
    if (0 < lVar15) {
      pOVar14 = (this_00->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                m_a;
      lVar16 = 0;
      do {
        iVar17 = (*(int *)((long)pOVar14->m_vi + lVar16 + -4) >> 0x1f) * -2 + 2;
        if (*(int *)((long)pOVar14->m_vi + lVar16) == *(int *)((long)pOVar14->m_vi + lVar16 + 4)) {
          iVar17 = 4;
        }
        *(int *)((long)pOVar14->m_vi + lVar16 + 0xc) = iVar17;
        puVar3 = (undefined8 *)((long)pOVar14->m_tolerance + lVar16);
        *puVar3 = 0;
        puVar3[1] = 0;
        lVar16 = lVar16 + 0xe8;
      } while (lVar15 * 0xe8 - lVar16 != 0);
    }
    iVar17 = (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this_00,0);
    if ((char)iVar17 != '\0') {
      return this_00;
    }
    if (local_70 == (ON_Brep *)0x0) {
      (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
    }
    else {
      ON_Brep::Destroy(local_70);
    }
  }
  return (ON_Brep *)0x0;
}

Assistant:

ON_Brep* ON_BrepWedge( const ON_3dPoint* corners, ON_Brep* pBrep )
{
  ON_Brep* brep = 0;

  int vi, ei, ti, fi, si, c2i;
  
  if(corners)
  {
    // use the one passed in or make a new one
    if( pBrep ) 
    {
      pBrep->Destroy();
      brep = pBrep;
    }
    else
      brep = new ON_Brep();
    
    brep->m_C2.Reserve(18);
    brep->m_C3.Reserve(9);
    brep->m_S.Reserve(5);
    brep->m_V.Reserve(6);
    brep->m_E.Reserve(9);
    brep->m_L.Reserve(5);
    brep->m_T.Reserve(18);
    brep->m_F.Reserve(5);

    // vertices
    for ( vi = 0; vi < 6; vi++ )
    {
      brep->NewVertex( corners[vi], 0.0 );
    }
    
    // 3d edges around bottom e0 - e2
    for ( ei = 0; ei < 3; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[(ei+1)%3];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    // 3d edges around top e3 - e5
    for ( ei = 3; ei < 6; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[ei==5?3:(ei+1)];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    // 3d vertical edges e6 - e8
    for ( ei = 6; ei < 9; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei-6];
      ON_BrepVertex& v1 = brep->m_V[ei-3];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }

    /*
    //
    //                      /v5    
    //                     /|\       
    //                    / | \     
    //                   e5 |  e4   
    //                  /   e8  \     
    //                 /__e3_____\  
    //               v3|    |    |v4     
    //                 |    |    |       
    //                 |    /v2  |   
    //                 e6  / \   e7   
    //                 |  /   \  |   
    //                 | e2    e1|   
    //                 |/       \|     
    //                 /____e0___\  
    //               v0           v1
    */

    struct {
      int e[4], bRev[4];
    } f[5] = {
      {{0, 7, 3, 6},  {false, false, true,  true}},  // vertical front
      {{1, 8, 4, 7},  {false, false, true,  true}},  // vertical right
      {{2, 6, 5, 8},  {false, false, true,  true}},  // vertical left
      {{2, 1, 0,-1},  {true,  true,  true,  true}},  // bottom
      {{3, 4, 5,-1},  {false, false, false, false}}  // top
    };
    for ( fi = 0; fi < 5; fi++ )
    {
      ON_BrepEdge* e0;
      ON_BrepEdge* e1;
      ON_BrepEdge* e2;
      ON_BrepEdge* e3=0;

      e0 = &brep->m_E[f[fi].e[0]];
      e1 = &brep->m_E[f[fi].e[1]];
      e2 = &brep->m_E[f[fi].e[2]];
      if( f[fi].e[3] >= 0)
        e3 = &brep->m_E[f[fi].e[3]];

      ON_BrepVertex* v0;
      ON_BrepVertex* v1;
      ON_BrepVertex* v2;
      ON_BrepVertex* v3=0;

      v0 = &brep->m_V[e0->m_vi[f[fi].bRev[0]?1:0]];
      v1 = &brep->m_V[e1->m_vi[f[fi].bRev[1]?1:0]];
      v2 = &brep->m_V[e2->m_vi[f[fi].bRev[2]?1:0]];
      if( f[fi].e[3] >= 0)
        v3 = &brep->m_V[e3->m_vi[f[fi].bRev[3]?1:0]];

      ON_NurbsSurface* srf;

      if( f[fi].e[3] >= 0)
        // 4 sided face
        srf = ON_NurbsSurfaceQuadrilateral( v0->point, v1->point, v2->point, v3->point);
      else
        // 3 sided face
        srf = ON_NurbsSurfaceQuadrilateral( v0->point, v1->point, v1->point + (v2->point - v0->point), v2->point);

      si = brep->AddSurface( srf);

      ON_Interval s = brep->m_S[si]->Domain(0);
      ON_Interval t = brep->m_S[si]->Domain(1);
      ON_2dPoint p0, p1, p2, p3;
      p0.Set(s[0],t[0]);
      p1.Set(s[1],t[0]);
      p2.Set(s[1],t[1]);
      p3.Set(s[0],t[1]);

      ON_BrepFace& face = brep->NewFace( si );
      ON_BrepLoop& loop = brep->NewLoop( ON_BrepLoop::outer, face );

      if( f[fi].e[3] >= 0)
      {
        // south side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p0, p1 ) );
        brep->NewTrim( *e0, f[fi].bRev[0], loop, c2i ).m_iso = ON_Surface::S_iso;
        
        // east side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p1, p2 ) );
        brep->NewTrim( *e1, f[fi].bRev[1], loop, c2i ).m_iso = ON_Surface::E_iso;
        
        // north side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p2, p3 ) );
        brep->NewTrim( *e2, f[fi].bRev[2], loop, c2i ).m_iso = ON_Surface::N_iso;

        // west side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p3, p0 ) );
        brep->NewTrim( *e3, f[fi].bRev[3], loop, c2i ).m_iso = ON_Surface::W_iso;
      }
      else
      {
        // south side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p0, p1 ) );
        brep->NewTrim( *e0, f[fi].bRev[0], loop, c2i ).m_iso = ON_Surface::S_iso;
        
        // diagonal from upper left to lower right
        c2i = brep->AddTrimCurve( new ON_LineCurve( p1, p3 ) );
        brep->NewTrim( *e1, f[fi].bRev[1], loop, c2i ).m_iso = ON_Surface::not_iso;

        // west side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p3, p0 ) );
        brep->NewTrim( *e2, f[fi].bRev[2], loop, c2i ).m_iso = ON_Surface::W_iso;
      }
    }

    // set trim m_type and m_tolerance[]
    for ( ti = 0; ti < brep->m_T.Count(); ti++ )
    {
      ON_BrepTrim& trim = brep->m_T[ti];
      trim.m_type =  ( trim.m_vi[0] != trim.m_vi[1] && trim.m_ei >= 0 )
                  ? ON_BrepTrim::mated
                  : ON_BrepTrim::singular;
      trim.m_tolerance[0] = 0.0;
      trim.m_tolerance[1] = 0.0;
    }

    if ( !brep->IsValid() ) {
      if ( pBrep )
        pBrep->Destroy();
      else
        delete brep;
      brep = 0;
    }
  }
  else 
    brep = 0;
  return brep;
}